

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::ungrabKeyboard
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QGraphicsItem **ppQVar5;
  undefined1 in_DL;
  QGraphicsItem *in_RSI;
  QListSpecialMethodsBase<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *last;
  int index;
  QEvent event_1;
  QEvent event;
  QGraphicsItem **in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  undefined1 itemIsDying_00;
  undefined3 in_stack_ffffffffffffffa4;
  uint uVar6;
  QListSpecialMethodsBase<QGraphicsItem_*> *event_00;
  QGraphicsItem *in_stack_ffffffffffffffb0;
  QGraphicsItem *item_00;
  QGraphicsScenePrivate *in_stack_ffffffffffffffb8;
  QGraphicsScenePrivate *this_00;
  undefined1 *local_40;
  undefined1 *local_38;
  char local_30 [24];
  QGraphicsItem *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_DL,in_stack_ffffffffffffffa4) & 0x1ffffff;
  event_00 = in_RDI;
  qVar4 = QListSpecialMethodsBase<QGraphicsItem*>::lastIndexOf<QGraphicsItem*>
                    (in_RDI,in_stack_ffffffffffffff88,0x9c4dfa);
  iVar3 = (int)qVar4;
  if (iVar3 == -1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(uVar6,0xffffffff),in_stack_ffffffffffffff98,
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning(local_30,"QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
  }
  else {
    ppQVar5 = QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_RSI);
    itemIsDying_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
    if (in_RSI != *ppQVar5) {
      QList<QGraphicsItem_*>::at((QList<QGraphicsItem_*> *)in_RDI,(qsizetype)in_RSI);
      ungrabKeyboard((QGraphicsScenePrivate *)CONCAT44(uVar6,iVar3),in_stack_ffffffffffffffe8,
                     (bool)itemIsDying_00);
    }
    if ((uVar6 & 0x1000000) == 0) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_40,UngrabKeyboard);
      sendEvent(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(QEvent *)event_00);
      QEvent::~QEvent((QEvent *)&local_40);
    }
    QList<QGraphicsItem_*>::takeLast((QList<QGraphicsItem_*> *)in_RDI);
    if ((uVar6 & 0x1000000) == 0) {
      bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c4efc);
      if (!bVar2) {
        QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_RSI);
        item_00 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
        this_00 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&stack0xffffffffffffffb0,GrabKeyboard);
        sendEvent(this_00,item_00,(QEvent *)event_00);
        QEvent::~QEvent((QEvent *)&stack0xffffffffffffffb0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabKeyboard(QGraphicsItem *item, bool itemIsDying)
{
    int index = keyboardGrabberItems.lastIndexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
        return;
    }
    if (item != keyboardGrabberItems.constLast()) {
        // Recursively ungrab the topmost keyboard grabber until we reach this
        // item to ensure state consistency.
        ungrabKeyboard(keyboardGrabberItems.at(index + 1), itemIsDying);
    }

    // Send notification about keyboard ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabKeyboard);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers.
    keyboardGrabberItems.takeLast();

    // Send notification about mouse regrab.
    if (!itemIsDying && !keyboardGrabberItems.isEmpty()) {
        QGraphicsItem *last = keyboardGrabberItems.constLast();
        QEvent event(QEvent::GrabKeyboard);
        sendEvent(last, &event);
    }
}